

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::cmFindBase(cmFindBase *this)

{
  cmFindCommon::cmFindCommon(&this->super_cmFindCommon);
  (this->super_cmFindCommon).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmFindBase_00651fe0;
  (this->VariableDocumentation)._M_dataplus._M_p = (pointer)&(this->VariableDocumentation).field_2;
  (this->VariableDocumentation)._M_string_length = 0;
  (this->VariableDocumentation).field_2._M_local_buf[0] = '\0';
  (this->VariableName)._M_dataplus._M_p = (pointer)&(this->VariableName).field_2;
  (this->VariableName)._M_string_length = 0;
  (this->VariableName).field_2._M_local_buf[0] = '\0';
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->EnvironmentPath)._M_dataplus._M_p = (pointer)&(this->EnvironmentPath).field_2;
  (this->EnvironmentPath)._M_string_length = 0;
  (this->EnvironmentPath).field_2._M_local_buf[0] = '\0';
  this->AlreadyInCache = false;
  this->AlreadyInCacheWithoutMetaInfo = false;
  this->NamesPerDir = false;
  this->NamesPerDirAllowed = false;
  return;
}

Assistant:

cmFindBase::cmFindBase()
{
  this->AlreadyInCache = false;
  this->AlreadyInCacheWithoutMetaInfo = false;
  this->NamesPerDir = false;
  this->NamesPerDirAllowed = false;
}